

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_net.cpp
# Opt level: O3

void Cmd_pings(FCommandLine *argv,APlayerPawn *who,int key)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  long lVar3;
  
  lVar3 = 0;
  do {
    if (playeringame[lVar3] == true) {
      puVar1 = (undefined8 *)
               ((ulong)(((&DAT_00a602d8)[lVar3 * 0xa8] - 1 & 0x1cf) * 0x18) +
               (&DAT_00a602c8)[lVar3 * 0x54]);
      do {
        puVar2 = puVar1;
        puVar1 = (undefined8 *)*puVar2;
      } while (*(int *)(puVar2 + 1) != 0x1cf);
      Printf("% 4d %s\n",(ulong)(currrecvtime[lVar3] - lastrecvtime[lVar3]),
             *(undefined8 *)(puVar2[2] + 0x28));
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 8);
  return;
}

Assistant:

CCMD (pings)
{
	int i;
	for (i = 0; i < MAXPLAYERS; i++)
		if (playeringame[i])
			Printf ("% 4d %s\n", currrecvtime[i] - lastrecvtime[i],
					players[i].userinfo.GetName());
}